

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86TEST(uchar *stream,x86Reg op1,x86Reg op2)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  
  bVar2 = 8 < (int)op1 | (8 < (int)op2) << 2;
  bVar3 = bVar2 != 0;
  if (bVar3) {
    *stream = bVar2 | 0x40;
  }
  stream[bVar3] = 0x85;
  uVar1 = encodeRegister(op1,regCode[op2]);
  stream[(ulong)bVar3 + 1] = uVar1;
  return bVar3 + 2;
}

Assistant:

int x86TEST(unsigned char *stream, x86Reg op1, x86Reg op2)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, op1, op2);
	*stream++ = 0x85;
	*stream++ = encodeRegister(op1, regCode[op2]);

	return int(stream - start);
}